

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<char,18446744073709551615ul>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<char,18446744073709551615ul>const&> *this,
          span<unsigned_char,_18446744073709551615UL> *rhs)

{
  lest *this_00;
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  span<unsigned_char,_18446744073709551615UL> *in_R8;
  string local_70;
  span<char,_18446744073709551615UL> local_50;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  sVar1 = *(size_type *)(this_00 + 8);
  if (sVar1 == rhs->size_) {
    bVar2 = true;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        in_R8 = (span<unsigned_char,_18446744073709551615UL> *)(ulong)rhs->data_[sVar3];
        if ((int)*(char *)(*(long *)this_00 + sVar3) != (uint)rhs->data_[sVar3]) goto LAB_0018b79d;
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
  }
  else {
LAB_0018b79d:
    bVar2 = false;
  }
  local_50.data_ = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"==","");
  to_string<nonstd::span_lite::span<char,18446744073709551615ul>,nonstd::span_lite::span<unsigned_char,18446744073709551615ul>>
            (&local_70,this_00,&local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar2;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_50.data_ != local_40) {
    operator_delete(local_50.data_,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }